

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O3

bool test_Player_reinforce(bool verbose)

{
  pointer ppPVar1;
  Hand *pHVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  pointer ppCVar4;
  Country *pCVar5;
  pointer pcVar6;
  GameLoop *pGVar7;
  pointer pCVar8;
  ostream *poVar9;
  iterator iVar10;
  vector<CardType,_std::allocator<CardType>_> *this;
  pointer ppCVar11;
  bool bVar12;
  long *local_58;
  long local_50;
  long local_48 [2];
  int local_38;
  int local_34;
  
  GameLoop::startSingle(true);
  pGVar7 = GameLoop::getInstance();
  ppPVar1 = (pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppPVar1) {
    pHVar2 = (*ppPVar1)->pCards;
    this = pHVar2->handPointer;
    local_58._0_4_ = 2;
    iVar10._M_current =
         (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pCVar8 = (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar10._M_current == pCVar8) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (this,iVar10,(CardType *)&local_58);
      this = pHVar2->handPointer;
      iVar10._M_current =
           (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pCVar8 = (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar10._M_current = CAVALRY;
      iVar10._M_current = iVar10._M_current + 1;
      (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar10._M_current;
    }
    local_58._0_4_ = 2;
    if (iVar10._M_current == pCVar8) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (this,iVar10,(CardType *)&local_58);
      this = pHVar2->handPointer;
      iVar10._M_current =
           (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pCVar8 = (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar10._M_current = CAVALRY;
      iVar10._M_current = iVar10._M_current + 1;
      (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar10._M_current;
    }
    local_58._0_4_ = 2;
    if (iVar10._M_current == pCVar8) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (this,iVar10,(CardType *)&local_58);
      this = pHVar2->handPointer;
      iVar10._M_current =
           (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pCVar8 = (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar10._M_current = CAVALRY;
      iVar10._M_current = iVar10._M_current + 1;
      (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar10._M_current;
    }
    local_58._0_4_ = 2;
    if (iVar10._M_current == pCVar8) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (this,iVar10,(CardType *)&local_58);
      this = pHVar2->handPointer;
      iVar10._M_current =
           (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pCVar8 = (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar10._M_current = CAVALRY;
      iVar10._M_current = iVar10._M_current + 1;
      (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar10._M_current;
    }
    local_58 = (long *)CONCAT44(local_58._4_4_,2);
    if (iVar10._M_current == pCVar8) {
      std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                (this,iVar10,(CardType *)&local_58);
    }
    else {
      *iVar10._M_current = CAVALRY;
      (this->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar10._M_current + 1;
    }
    pGVar7 = GameLoop::getInstance();
    ppPVar1 = (pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppPVar1) {
      pvVar3 = (*ppPVar1)->pOwnedCountries;
      ppCVar11 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      if ((pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
          super__Vector_impl_data._M_finish != ppCVar11) {
        local_34 = *(*ppCVar11)->pNumberOfTroops;
        pGVar7 = GameLoop::getInstance();
        ppPVar1 = (pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_finish != ppPVar1) {
          local_38 = Player::reinforce(*ppPVar1);
          if (verbose) {
            pGVar7 = GameLoop::getInstance();
            ppPVar1 = (pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if ((pGVar7->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                _M_impl.super__Vector_impl_data._M_finish == ppPVar1) goto LAB_0010a1e2;
            pvVar3 = (*ppPVar1)->pOwnedCountries;
            ppCVar11 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
            ppCVar4 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppCVar11 != ppCVar4) {
              do {
                pCVar5 = *ppCVar11;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\x1b[35m",5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"player1\'s ",10);
                pcVar6 = (pCVar5->cyName->_M_dataplus)._M_p;
                local_58 = local_48;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_58,pcVar6,pcVar6 + pCVar5->cyName->_M_string_length);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_58,local_50);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," had ",5);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_34);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," armies",7);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                if (local_58 != local_48) {
                  operator_delete(local_58,local_48[0] + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"player1\'s ",10);
                pcVar6 = (pCVar5->cyName->_M_dataplus)._M_p;
                local_58 = local_48;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_58,pcVar6,pcVar6 + pCVar5->cyName->_M_string_length);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_58,local_50);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," now has ",9);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pCVar5->pNumberOfTroops);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," armies",7);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                if (local_58 != local_48) {
                  operator_delete(local_58,local_48[0] + 1);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\x1b[31m",5);
                ppCVar11 = ppCVar11 + 1;
              } while (ppCVar11 != ppCVar4);
            }
          }
          bVar12 = local_38 != -1;
          GameLoop::resetInstance();
          return bVar12;
        }
      }
    }
  }
LAB_0010a1e2:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

bool test_Player_reinforce(bool verbose = false) {

    // Arrange
    bool success = true;
    GameLoop::startSingle(true);
    Hand* pHand = GameLoop::getInstance()->getAllPlayers()->at(0)->getCards();
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);
    pHand->getHand()->push_back(CardType::CAVALRY);

    int numArmiesC1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getNumberOfTroops();

    if (GameLoop::getInstance()->getAllPlayers()->at(0)->reinforce() == PlayerAction::FAILED) {
        success = false;
    }

    if (verbose) {
        for (auto* c: *GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()) {
            std::cout << "\033[35m";
            std::cout << "player1's " << c->getCountryName() << " had " << numArmiesC1 << " armies" << std::endl;
            std::cout << "player1's " << c->getCountryName() << " now has " << c->getNumberOfTroops()
                      << " armies" << std::endl;
            std::cout << "\033[31m";
        }
    }
    GameLoop::resetInstance();
    return success;
}